

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O0

void __thiscall SimpleVendor::SimpleVendor(SimpleVendor *this,int argc,char **argv,VendorIo *io)

{
  VendorIo *pVVar1;
  int iVar2;
  uint uVar3;
  invalid_argument *this_00;
  VendorIo *io_local;
  char **argv_local;
  int argc_local;
  SimpleVendor *this_local;
  
  Vendor::Vendor(&this->super_Vendor,argc,argv);
  (this->super_Vendor)._vptr_Vendor = (_func_int **)&PTR_ValidatePrice_00104cc8;
  this->vio = io;
  iVar2 = Vendor::GetPrice(&this->super_Vendor);
  if (iVar2 != 0) {
    uVar3 = (**(this->super_Vendor)._vptr_Vendor)();
    if ((uVar3 & 1) != 0) {
      pVVar1 = this->vio;
      uVar3 = Vendor::GetPrice(&this->super_Vendor);
      (*pVVar1->_vptr_VendorIo[6])(pVVar1,(ulong)uVar3);
      return;
    }
  }
  (*this->vio->_vptr_VendorIo[1])(this->vio,*argv);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid price");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

SimpleVendor::SimpleVendor(int argc, char **argv, VendorIo *io) : vio(io), Vendor(argc, argv) {
    if (GetPrice() == 0 || !ValidatePrice()) {
        vio->PrintUsage(argv[0]);
        throw invalid_argument("invalid price");
    }
    vio->PrintWelcomeMessage(GetPrice());
}